

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

int test_encode_int_all_sizes(char (*mp_nums) [16],int64_t val)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    if (0xf < uVar2) {
      __assert_fail("used < MP_NUMBER_CODEC_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x35e,"int test_encode_int_all_sizes(char (*)[16], int64_t)");
    }
    bVar1 = test_encode_int_custom_size(mp_nums[uVar2],val,*(int *)((long)&DAT_00139e40 + lVar3));
    uVar2 = uVar2 + bVar1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x14);
  return uVar2;
}

Assistant:

static int
test_encode_int_all_sizes(char mp_nums[][MP_NUMBER_MAX_LEN], int64_t val)
{
	int sizes[] = {1, 2, 3, 5, 9};
	int count = lengthof(sizes);
	int used = 0;
	for (int i = 0; i < count; ++i) {
		assert(used < MP_NUMBER_CODEC_COUNT);
		if (test_encode_int_custom_size(mp_nums[used], val, sizes[i]))
			++used;
	}
	return used;
}